

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapePaddingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  Type *pTVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  ShapeRange *pSVar3;
  PaddingLayerParams *from;
  Type *pTVar4;
  uint64 val;
  BorderAmounts *pBVar5;
  uint64 val_00;
  uint64 val_01;
  size_t local_a0;
  ShapeRange local_98;
  ShapeRange local_78;
  PaddingLayerParams padding;
  
  local_a0 = 0;
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_01,pTVar1);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&padding,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&padding);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&padding,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&padding);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar2);
  from = Specification::NeuralNetworkLayer::padding(specLayer);
  Specification::PaddingLayerParams::PaddingLayerParams(&padding,from);
  pBVar5 = padding.paddingamounts_;
  if (padding.paddingamounts_ == (BorderAmounts *)0x0) {
    pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
  }
  if ((pBVar5->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    val_01 = 0;
    val_00 = 0;
    val = 0;
  }
  else {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                       (&(pBVar5->borderamounts_).super_RepeatedPtrFieldBase,0);
    pBVar5 = padding.paddingamounts_;
    if (padding.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    val_00 = pTVar4->startedgesize_;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                       (&(pBVar5->borderamounts_).super_RepeatedPtrFieldBase,0);
    pBVar5 = padding.paddingamounts_;
    if (padding.paddingamounts_ == (BorderAmounts *)0x0) {
      pBVar5 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    val = pTVar4->endedgesize_;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                       (&(pBVar5->borderamounts_).super_RepeatedPtrFieldBase,1);
    if (padding.paddingamounts_ == (BorderAmounts *)0x0) {
      padding.paddingamounts_ = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
    }
    local_a0 = pTVar4->startedgesize_;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                       (&((padding.paddingamounts_)->borderamounts_).super_RepeatedPtrFieldBase,1);
    val_01 = pTVar4->endedgesize_;
  }
  pSVar2 = ShapeConstraint::channelRange(this_01);
  pSVar3 = ShapeConstraint::channelRange(this_00);
  ShapeRange::intersect(&local_98,pSVar2,pSVar3);
  ShapeConstraint::updateChannelRange(this_01,&local_98);
  pSVar2 = ShapeConstraint::heightRange(this_00);
  ShapeRange::operator+(&local_78,pSVar2,val_00);
  ShapeRange::operator+(&local_98,&local_78,val);
  ShapeConstraint::updateHeightRange(this_01,&local_98);
  pSVar2 = ShapeConstraint::widthRange(this_00);
  ShapeRange::operator+(&local_78,pSVar2,val_01);
  ShapeRange::operator+(&local_98,&local_78,local_a0);
  ShapeConstraint::updateWidthRange(this_01,&local_98);
  pSVar2 = ShapeConstraint::heightRange(this_01);
  ShapeRange::operator-(&local_78,pSVar2,val_00);
  ShapeRange::operator-(&local_98,&local_78,val);
  ShapeConstraint::updateHeightRange(this_00,&local_98);
  pSVar2 = ShapeConstraint::widthRange(this_01);
  ShapeRange::operator-(&local_78,pSVar2,local_a0);
  ShapeRange::operator-(&local_98,&local_78,val_01);
  ShapeConstraint::updateWidthRange(this_00,&local_98);
  Specification::PaddingLayerParams::~PaddingLayerParams(&padding);
  return;
}

Assistant:

void NeuralNetworkShaper::shapePaddingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    Specification::PaddingLayerParams padding = specLayer.padding();

    size_t l, r, t, b;
    l = r = t = b = 0;
    if (padding.paddingamounts().borderamounts_size() != 0){
        t = (size_t)padding.paddingamounts().borderamounts(0).startedgesize();
        b = (size_t)padding.paddingamounts().borderamounts(0).endedgesize();
        l = (size_t)padding.paddingamounts().borderamounts(1).startedgesize();
        r = (size_t)padding.paddingamounts().borderamounts(1).endedgesize();
    }
    outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
    outputShape.updateHeightRange(inputShape.heightRange() + t + b);
    outputShape.updateWidthRange(inputShape.widthRange() + r + l);
    
    // If a fixed constraint for the output shape emerges later in the network, then we can infer a lower bound for the input shape
    inputShape.updateHeightRange(outputShape.heightRange() - t - b);
    inputShape.updateWidthRange(outputShape.widthRange() - l - r);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Padding layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Padding layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}